

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O1

bool __thiscall QDtls::setPeerVerificationName(QDtls *this,QString *name)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long in_FS_OFFSET;
  QArrayData *local_38 [3];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 != (long *)0x0) {
    iVar3 = (**(code **)(*plVar1 + 0x90))(plVar1);
    plVar4 = (long *)(*(long *)(*plVar1 + -0x60) + (long)plVar1);
    if (iVar3 == 0) {
      (**(code **)(*plVar4 + 0x28))(plVar4);
      (**(code **)(*plVar1 + 0x70))(plVar1,name);
      bVar2 = true;
      goto LAB_0025a8f2;
    }
    QMetaObject::tr((char *)local_38,(char *)&staticMetaObject,0x285043);
    (**(code **)(*plVar4 + 0x10))(plVar4,2,local_38);
    if (local_38[0] != (QArrayData *)0x0) {
      LOCK();
      (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38[0],2,0x10);
      }
    }
  }
  bVar2 = false;
LAB_0025a8f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::setPeerVerificationName(const QString &name)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (backend->state() != HandshakeNotStarted) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                        tr("Cannot set verification name after handshake started"));
        return false;
    }

    backend->clearDtlsError();
    backend->setPeerVerificationName(name);

    return true;
}